

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O2

RK_U32 mpp_slots_is_empty(MppBufSlots slots,SlotQueueType type)

{
  long *plVar1;
  RK_U32 RVar2;
  AutoMutex auto_lock;
  
  if (slots == (MppBufSlots)0x0) {
    RVar2 = 0;
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_slots_is_empty");
  }
  else {
    auto_lock.mLock = *slots;
    auto_lock.mEnabled = 1;
    if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
    }
    plVar1 = (long *)((long)slots + (ulong)type * 0x10 + 0xa0);
    RVar2 = (RK_U32)((long *)*plVar1 == plVar1);
    Mutex::Autolock::~Autolock(&auto_lock);
  }
  return RVar2;
}

Assistant:

RK_U32 mpp_slots_is_empty(MppBufSlots slots, SlotQueueType type)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return 0;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    return list_empty(&impl->queue[type]) ? 1 : 0;
}